

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int count_rows(MATRIX *matrix,int n,int i)

{
  pointer pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  pvVar1 = (matrix->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(matrix->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(*(int *)(*(long *)&pvVar1[i].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + lVar4 * 4) == n);
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int count_rows(MATRIX &matrix, int n, int i){
    int n_rows=0;
    for(int j=0; j<matrix.size(); j++){
        if (matrix[i][j]==n){
            n_rows++;
        }
    }
    return n_rows;
}